

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signal_ports.cpp
# Opt level: O2

int __thiscall sc_core::sc_in<bool>::vbind(sc_in<bool> *this,sc_port_base *parent_)

{
  socklen_t __len;
  undefined1 auVar1 [16];
  
  __len = 0;
  auVar1 = __dynamic_cast(parent_,&sc_port_base::typeinfo,
                          &sc_port<sc_core::sc_signal_in_if<bool>,1,(sc_core::sc_port_policy)0>::
                           typeinfo);
  if (auVar1._0_8_ == 0) {
    __len = 0;
    auVar1 = __dynamic_cast(parent_,&sc_port_base::typeinfo,
                            &sc_port<sc_core::sc_signal_inout_if<bool>,1,(sc_core::sc_port_policy)0>
                             ::typeinfo);
    if (auVar1._0_8_ == 0) {
      return 2;
    }
  }
  sc_port_base::bind((sc_port_base *)this,auVar1._0_4_,auVar1._8_8_,__len);
  return 0;
}

Assistant:

int
sc_in<bool>::vbind( sc_port_base& parent_ )
{
    in_port_type* in_parent = dynamic_cast<in_port_type*>( &parent_ );
    if( in_parent != 0 ) {
	sc_port_base::bind( *in_parent );
	return 0;
    }
    inout_port_type* inout_parent = dynamic_cast<inout_port_type*>( &parent_ );
    if( inout_parent != 0 ) {
	sc_port_base::bind( *inout_parent );
	return 0;
    }
    // type mismatch
    return 2;
}